

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BooPHF.h
# Opt level: O3

uint64_t __thiscall boomphf::bitVector::build_ranks(bitVector *this,uint64_t offset)

{
  iterator __position;
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  uint64_t curent_rank;
  unsigned_long local_40;
  vector<unsigned_long,std::allocator<unsigned_long>> *local_38;
  
  local_38 = (vector<unsigned_long,std::allocator<unsigned_long>> *)&this->_ranks;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_38,
             (this->_size >> 9) + 2);
  if (this->_nchar != 0) {
    uVar4 = 0;
    local_40 = offset;
    do {
      if ((uVar4 & 7) == 0) {
        __position._M_current =
             (this->_ranks).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->_ranks).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
            .super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long_const&>(local_38,__position,&local_40);
        }
        else {
          *__position._M_current = local_40;
          (this->_ranks).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
      }
      uVar1 = this->_bitArray[uVar4];
      uVar2 = (int)uVar1 - ((uint)(uVar1 >> 1) & 0x55555555);
      uVar3 = (uVar2 >> 2 & 0x33333333) + (uVar2 & 0x33333333);
      uVar2 = (uint)(uVar1 >> 0x20);
      uVar2 = uVar2 - (uVar2 >> 1 & 0x55555555);
      uVar2 = (uVar2 >> 2 & 0x33333333) + (uVar2 & 0x33333333);
      offset = ((((uVar2 >> 4) + uVar2 & 0xf0f0f0f) * 0x1010101 >> 0x18) +
               (((uVar3 >> 4) + uVar3 & 0xf0f0f0f) * 0x1010101 >> 0x18)) + local_40;
      uVar4 = uVar4 + 1;
      local_40 = offset;
    } while (uVar4 < this->_nchar);
  }
  return offset;
}

Assistant:

uint64_t build_ranks(uint64_t offset =0)
		{
			_ranks.reserve(2+ _size/_nb_bits_per_rank_sample);

			uint64_t curent_rank = offset;
			for (size_t ii = 0; ii < _nchar; ii++) {
				if (((ii*64)  % _nb_bits_per_rank_sample) == 0) {
					_ranks.push_back(curent_rank);
				}
				curent_rank +=  popcount_64(_bitArray[ii]);
			}

			return curent_rank;
		}